

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::RemoveRedundantOperands::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *param_1,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *param_3)

{
  bool bVar1;
  uint uVar2;
  Op OVar3;
  uint32_t uVar4;
  Operand *pOVar5;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar6;
  uint32_t local_a4;
  _Node_iterator_base<unsigned_int,_false> local_a0;
  undefined1 local_98;
  uint local_8c;
  undefined1 local_88 [4];
  uint32_t i;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> new_operands;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_operands;
  bool has_redundant_operand;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_3_local;
  Instruction *inst_local;
  IRContext *param_1_local;
  anon_class_1_0_00000001 *this_local;
  
  OVar3 = Instruction::opcode(inst);
  if (OVar3 == OpEntryPoint) {
    bVar1 = false;
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&new_operands.
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_88);
    pOVar5 = Instruction::GetOperand(inst,0);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spvtools::opt::Operand&>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_88,
               pOVar5);
    pOVar5 = Instruction::GetOperand(inst,1);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spvtools::opt::Operand&>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_88,
               pOVar5);
    pOVar5 = Instruction::GetOperand(inst,2);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spvtools::opt::Operand&>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_88,
               pOVar5);
    for (local_8c = 3; uVar2 = local_8c, uVar4 = Instruction::NumOperands(inst), uVar2 < uVar4;
        local_8c = local_8c + 1) {
      local_a4 = Instruction::GetSingleWordOperand(inst,local_8c);
      pVar6 = std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&new_operands.
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_a4);
      local_a0._M_cur =
           (__node_type *)pVar6.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_98 = pVar6.second;
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        bVar1 = true;
      }
      else {
        pOVar5 = Instruction::GetOperand(inst,local_8c);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_88
                   ,pOVar5);
      }
    }
    if (bVar1) {
      Instruction::SetInOperands(inst,(OperandList *)local_88);
    }
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_88);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&new_operands.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return bVar1;
  }
  __assert_fail("inst->opcode() == spv::Op::OpEntryPoint && \"Wrong opcode.  Should be OpEntryPoint.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0xad6,
                "auto spvtools::opt::(anonymous namespace)::RemoveRedundantOperands()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
               );
}

Assistant:

FoldingRule RemoveRedundantOperands() {
  return [](IRContext*, Instruction* inst,
            const std::vector<const analysis::Constant*>&) {
    assert(inst->opcode() == spv::Op::OpEntryPoint &&
           "Wrong opcode.  Should be OpEntryPoint.");
    bool has_redundant_operand = false;
    std::unordered_set<uint32_t> seen_operands;
    std::vector<Operand> new_operands;

    new_operands.emplace_back(inst->GetOperand(0));
    new_operands.emplace_back(inst->GetOperand(1));
    new_operands.emplace_back(inst->GetOperand(2));
    for (uint32_t i = 3; i < inst->NumOperands(); ++i) {
      if (seen_operands.insert(inst->GetSingleWordOperand(i)).second) {
        new_operands.emplace_back(inst->GetOperand(i));
      } else {
        has_redundant_operand = true;
      }
    }

    if (!has_redundant_operand) {
      return false;
    }

    inst->SetInOperands(std::move(new_operands));
    return true;
  };
}